

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

double xmlXPathCastNodeToNumber(xmlNodePtr node)

{
  xmlChar *str;
  double dVar1;
  
  if ((node != (xmlNodePtr)0x0) && (str = xmlXPathCastNodeToString(node), str != (xmlChar *)0x0)) {
    dVar1 = xmlXPathStringEvalNumber(str);
    (*xmlFree)(str);
    return dVar1;
  }
  return NAN;
}

Assistant:

double
xmlXPathCastNodeToNumber (xmlNodePtr node) {
    xmlChar *strval;
    double ret;

    if (node == NULL)
	return(NAN);
    strval = xmlXPathCastNodeToString(node);
    if (strval == NULL)
	return(NAN);
    ret = xmlXPathCastStringToNumber(strval);
    xmlFree(strval);

    return(ret);
}